

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditField.cpp
# Opt level: O2

double __thiscall CreditField::AddCredit(CreditField *this,double *credit)

{
  double dVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  double addCreditConvert;
  string addCredit;
  istringstream istr;
  istringstream istr_1;
  
  addCredit._M_dataplus._M_p = (pointer)&addCredit.field_2;
  addCredit._M_string_length = 0;
  addCredit.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Insert Credit: ");
  std::operator>>((istream *)&std::cin,(string *)&addCredit);
  for (uVar3 = 0; uVar3 < addCredit._M_string_length; uVar3 = uVar3 + 1) {
    if (9 < (int)addCredit._M_dataplus._M_p[uVar3] - 0x30U &&
        addCredit._M_dataplus._M_p[uVar3] != 0x2e) {
      poVar2 = std::operator<<((ostream *)&std::cout,"counterfeit!");
      std::endl<char,std::char_traits<char>>(poVar2);
      _istr = 3;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)&istr);
      *addCredit._M_dataplus._M_p = '\0';
      AddCredit(this,credit);
    }
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&istr,(string *)&addCredit,_S_in);
  std::istream::_M_extract<double>((double *)&istr);
  while (10000.0 < addCreditConvert) {
    std::operator<<((ostream *)&std::cout,"The Limit is: ");
    poVar2 = std::ostream::_M_insert<double>(10000.0);
    poVar2 = std::operator<<(poVar2," Euro!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Invalid Input!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Insert Credit To Play:");
    std::operator>>((istream *)&std::cin,(string *)&addCredit);
    std::__cxx11::istringstream::istringstream((istringstream *)&istr_1,(string *)&addCredit,_S_in);
    std::istream::_M_extract<double>((double *)&istr_1);
    std::__cxx11::istringstream::~istringstream((istringstream *)&istr_1);
  }
  *credit = addCreditConvert + *credit;
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Current Credit: ");
  poVar2 = std::ostream::_M_insert<double>(*credit);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar1 = *credit;
  std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
  std::__cxx11::string::~string((string *)&addCredit);
  return dVar1;
}

Assistant:

double CreditField::AddCredit(double &credit) {
	std::string addCredit;
	std::cout << "Insert Credit: ";
	std::cin >> addCredit;
	for (int i = 0; i < addCredit.size(); i++) {
		if (!isdigit(addCredit[i]) && addCredit[i] != '.') {
			std::cout << "counterfeit!" << std::endl;
			std::chrono::seconds duration(3);
			std::this_thread::sleep_for(duration);
			addCredit[0] = 0;
			AddCredit(credit);
			
			//exit(0);
		}
	}
	double addCreditConvert;
	std::istringstream istr(addCredit);
	istr >> addCreditConvert;
	while (addCreditConvert > addCreditLimit) {
		std::cout << "The Limit is: " << addCreditLimit<< " Euro!" << std::endl;
		std::cout << "Invalid Input!" << std::endl;
		std::cout << "Insert Credit To Play:";
		std::cin >> addCredit;
		std::istringstream istr(addCredit);
		istr >> addCreditConvert;
	}
	credit += addCreditConvert;
	std::cout << "---------------------------" << std::endl;
	std::cout << "Current Credit: " << credit << std::endl;
	std::cout << "---------------------------" << std::endl;
	return credit;
}